

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-timesamples-array.cc
# Opt level: O2

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseTimeSampleValueOfArrayType
          (AsciiParser *this,string *type_name,Value *result)

{
  bool bVar1;
  value_type_conflict5 *pvVar2;
  ostream *poVar3;
  optional<unsigned_int> type_id;
  ostringstream ss_e;
  optional<unsigned_int> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b8;
  optional<unsigned_int> local_198 [47];
  
  tinyusdz::value::TryGetTypeId(local_198,type_name);
  local_1c0.has_value_ = local_198[0].has_value_;
  if (local_198[0].has_value_ == false) {
    ::std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
    poVar3 = ::std::operator<<(poVar3,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser-timesamples-array.cc"
                              );
    poVar3 = ::std::operator<<(poVar3,":");
    poVar3 = ::std::operator<<(poVar3,"ParseTimeSampleValueOfArrayType");
    poVar3 = ::std::operator<<(poVar3,"():");
    poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xda);
    ::std::operator<<(poVar3," ");
    ::std::operator+(&local_1b8,"Unsupported/invalid type name: ",type_name);
    poVar3 = ::std::operator<<((ostream *)local_198,(string *)&local_1b8);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::stringbuf::str();
    PushError(this,&local_1b8);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    bVar1 = false;
  }
  else {
    local_1c0.contained = local_198[0].contained;
    pvVar2 = nonstd::optional_lite::optional<unsigned_int>::value(&local_1c0);
    bVar1 = ParseTimeSampleValueOfArrayType(this,*pvVar2,result);
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ParseTimeSampleValueOfArrayType(const std::string &type_name, value::Value *result) {
  nonstd::optional<uint32_t> type_id = value::TryGetTypeId(type_name);
  if (!type_id) {
    PUSH_ERROR_AND_RETURN("Unsupported/invalid type name: " + type_name);
  }

  return ParseTimeSampleValueOfArrayType(type_id.value(), result);
}